

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall
ThreadPool::add(ThreadPool *this,function<void_()> *task,function<void_()> *callback)

{
  ThreadTask *this_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppTVar5;
  function<void_()> local_68;
  function<void_()> local_48;
  int local_28;
  int local_24;
  int i;
  int index;
  function<void_()> *callback_local;
  function<void_()> *task_local;
  ThreadPool *this_local;
  
  local_24 = 0;
  local_28 = 1;
  _i = callback;
  callback_local = task;
  task_local = (function<void_()> *)this;
  while( true ) {
    uVar3 = (ulong)local_28;
    sVar4 = std::vector<ThreadTask_*,_std::allocator<ThreadTask_*>_>::size(&this->_workers);
    if (sVar4 <= uVar3) break;
    ppTVar5 = std::vector<ThreadTask_*,_std::allocator<ThreadTask_*>_>::operator[]
                        (&this->_workers,(long)local_28);
    iVar1 = ThreadTask::getSize(*ppTVar5);
    ppTVar5 = std::vector<ThreadTask_*,_std::allocator<ThreadTask_*>_>::operator[]
                        (&this->_workers,(long)local_24);
    iVar2 = ThreadTask::getSize(*ppTVar5);
    if (iVar1 < iVar2) {
      local_24 = local_28;
    }
    local_28 = local_28 + 1;
  }
  ppTVar5 = std::vector<ThreadTask_*,_std::allocator<ThreadTask_*>_>::operator[]
                      (&this->_workers,(long)local_24);
  this_00 = *ppTVar5;
  std::function<void_()>::function(&local_48,task);
  std::function<void_()>::function(&local_68,callback);
  ThreadTask::add(this_00,&local_48,&local_68);
  std::function<void_()>::~function(&local_68);
  std::function<void_()>::~function(&local_48);
  return;
}

Assistant:

void add(std::function<void()> task, std::function<void()> callback = nullptr)
	{
		int index = 0;
		for (int i = 1; i < _workers.size(); ++i)
		{
			if (_workers[i]->getSize() < _workers[index]->getSize())
				index = i;
		}
		_workers[index]->add(task, callback);
	}